

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O1

int mriStep_NlsLSetup(int jbad,int *jcur,void *arkode_mem)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"mriStep_NlsLSetup",&local_18,&local_20);
  if (iVar1 == 0) {
    if (jbad != 0) {
      local_20->convfail = 1;
    }
    local_20->nsetups = local_20->nsetups + 1;
    iVar1 = (*local_20->lsetup)(local_18,local_20->convfail,local_18->tcur,local_18->ycur,
                                local_20->Fsi[local_20->stage_map[local_20->istage]],&local_20->jcur
                                ,local_18->tempv1,local_18->tempv2,local_18->tempv3);
    *jcur = local_20->jcur;
    local_18->firststage = 0;
    local_20->crate = 1.0;
    local_20->gamrat = 1.0;
    local_20->gammap = local_20->gamma;
    local_20->nstlp = local_18->nst;
    if (iVar1 < 0) {
      iVar1 = -6;
    }
    else {
      iVar1 = (uint)(iVar1 != 0) << 2;
    }
  }
  return iVar1;
}

Assistant:

int mriStep_NlsLSetup(booleantype jbad, booleantype* jcur, void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_NlsLSetup",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* update convfail based on jbad flag */
  if (jbad)  step_mem->convfail = ARK_FAIL_BAD_J;

  /* Use ARKode's tempv1, tempv2 and tempv3 as
     temporary vectors for the linear solver setup routine */
  step_mem->nsetups++;
  retval = step_mem->lsetup(ark_mem, step_mem->convfail, ark_mem->tcur,
                            ark_mem->ycur,
                            step_mem->Fsi[step_mem->stage_map[step_mem->istage]],
                            &(step_mem->jcur), ark_mem->tempv1,
                            ark_mem->tempv2, ark_mem->tempv3);

  /* update Jacobian status */
  *jcur = step_mem->jcur;

  /* update flags and 'gamma' values for last lsetup call */
  ark_mem->firststage = SUNFALSE;
  step_mem->gamrat = step_mem->crate = ONE;
  step_mem->gammap = step_mem->gamma;
  step_mem->nstlp  = ark_mem->nst;

  if (retval < 0) return(ARK_LSETUP_FAIL);
  if (retval > 0) return(CONV_FAIL);

  return(ARK_SUCCESS);
}